

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

char * __thiscall
google::protobuf::MessageLite::_InternalParse(MessageLite *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  uint uVar2;
  TcParseTableBase *table;
  ulong uVar3;
  ushort *local_30;
  
  table = GetTcParseTable(this);
  local_30 = (ushort *)ptr;
  while( true ) {
    bVar1 = internal::ParseContext::Done(ctx,(char **)&local_30);
    if (bVar1) break;
    uVar2 = (uint)table->fast_idx_mask & (uint)*local_30;
    if ((uVar2 & 7) != 0) {
      internal::protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar3 = (ulong)(uVar2 & 0xfffffff8);
    local_30 = (ushort *)
               (**(code **)(&table[1].has_bits_offset + uVar3))
                         (this,local_30,ctx,
                          (ulong)*local_30 ^ *(ulong *)(&table[1].fast_idx_mask + uVar3 * 2),table,0
                         );
    if ((local_30 == (ushort *)0x0) || ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0))
    break;
  }
  if ((table->field_0x9 & 1) == 0) {
    if (local_30 == (ushort *)0x0) {
      internal::TcParser::VerifyHasBitConsistency(this,table);
    }
  }
  else {
    local_30 = (ushort *)(*table->post_loop_handler)(this,(char *)local_30,ctx);
  }
  return (char *)local_30;
}

Assistant:

const char* MessageLite::_InternalParse(const char* ptr,
                                        internal::ParseContext* ctx) {
  return internal::TcParser::ParseLoop(this, ptr, ctx, GetTcParseTable());
}